

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int al_fungetc(ALLEGRO_FILE *f,int c)

{
  _func_int_ALLEGRO_FILE_ptr_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  int iVar2;
  
  UNRECOVERED_JUMPTABLE = f->vtable->fi_fungetc;
  if (UNRECOVERED_JUMPTABLE != (_func_int_ALLEGRO_FILE_ptr_int *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(f,c);
    return iVar1;
  }
  iVar1 = f->ungetc_len;
  iVar2 = -1;
  if ((long)iVar1 != 0x10) {
    f->ungetc_len = iVar1 + 1;
    f->ungetc[iVar1] = (uchar)c;
    iVar2 = c;
  }
  return iVar2;
}

Assistant:

int al_fungetc(ALLEGRO_FILE *f, int c)
{
   ASSERT(f != NULL);

   if (f->vtable->fi_fungetc) {
      return f->vtable->fi_fungetc(f, c);
   }
   else {
      /* If the interface does not provide an implementation for ungetc,
       * then a default one will be used. (Note that if the interface does
       * implement it, then this ungetc buffer will never be filled, and all
       * other references to it within this file will always be ignored.)
       */
      if (f->ungetc_len == ALLEGRO_UNGETC_SIZE) {
         return EOF;
      }

      f->ungetc[f->ungetc_len++] = (unsigned char) c;

      return c;
   }
}